

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O0

bool __thiscall
tinyusdz::SkelAnimation::get_blendShapeWeights
          (SkelAnimation *this,vector<float,_std::allocator<float>_> *vals,double t,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  undefined1 local_70 [8];
  Animatable<std::vector<float,_std::allocator<float>_>_> v;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  vector<float,_std::allocator<float>_> *vals_local;
  SkelAnimation *this_local;
  
  v._ts._28_4_ = tinterp;
  Animatable<std::vector<float,_std::allocator<float>_>_>::Animatable
            ((Animatable<std::vector<float,_std::allocator<float>_>_> *)local_70);
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::
          get_value(&this->blendShapeWeights,
                    (Animatable<std::vector<float,_std::allocator<float>_>_> *)local_70);
  if (bVar1) {
    this_local._7_1_ =
         Animatable<std::vector<float,_std::allocator<float>_>_>::get
                   ((Animatable<std::vector<float,_std::allocator<float>_>_> *)local_70,t,vals,
                    v._ts._28_4_);
  }
  else {
    this_local._7_1_ = false;
  }
  Animatable<std::vector<float,_std::allocator<float>_>_>::~Animatable
            ((Animatable<std::vector<float,_std::allocator<float>_>_> *)local_70);
  return this_local._7_1_;
}

Assistant:

bool SkelAnimation::get_blendShapeWeights(
    std::vector<float> *vals, const double t,
    const value::TimeSampleInterpolationType tinterp) {
  Animatable<std::vector<float>> v;
  if (blendShapeWeights.get_value(&v)) {
    // Evaluate at time `t` with `tinterp` interpolation
    return v.get(t, vals, tinterp);
  }

  return false;
}